

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicList::Builder::Builder(Builder *this,ListSchema schema,OrphanBuilder *orphan)

{
  ElementSize elementSize;
  Which WVar1;
  StructSize elementSize_00;
  StructSchema schema_00;
  OrphanBuilder *orphan_local;
  Builder *this_local;
  ListSchema schema_local;
  
  schema_local.elementType._0_8_ = schema.elementType.field_4;
  this_local = schema.elementType._0_8_;
  *(Builder **)&(this->schema).elementType = this_local;
  (this->schema).elementType.field_4.scopeId = schema_local.elementType._0_8_;
  WVar1 = ListSchema::whichElementType((ListSchema *)&this_local);
  if (WVar1 == STRUCT) {
    schema_00 = ListSchema::getStructElementType((ListSchema *)&this_local);
    elementSize_00 = anon_unknown_70::structSizeFromSchema(schema_00);
    capnp::_::OrphanBuilder::asStructList(&this->builder,orphan,elementSize_00);
  }
  else {
    WVar1 = ListSchema::whichElementType((ListSchema *)&this_local);
    elementSize = anon_unknown_70::elementSizeFor(WVar1);
    capnp::_::OrphanBuilder::asList(&this->builder,orphan,elementSize);
  }
  return;
}

Assistant:

DynamicList::Builder::Builder(ListSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(schema.whichElementType() == schema::Type::STRUCT
        ? orphan.asStructList(structSizeFromSchema(schema.getStructElementType()))
        : orphan.asList(elementSizeFor(schema.whichElementType()))) {}